

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O2

void __thiscall
rapidjson::
GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::~GenericSchemaDocument
          (GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
           *this)

{
  SchemaEntry *this_00;
  
  while ((this->schemaMap_).stackTop_ != (this->schemaMap_).stack_) {
    this_00 = internal::Stack<rapidjson::CrtAllocator>::
              Pop<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>::SchemaEntry>
                        (&this->schemaMap_,1);
    SchemaEntry::~SchemaEntry(this_00);
  }
  if (this->typeless_ !=
      (Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
       *)0x0) {
    internal::
    Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
    ::~Schema(this->typeless_);
    free(this->typeless_);
  }
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::SetNull(&this->uri_);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::SetNull(&this->error_);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::SetNull(&this->currentError_);
  operator_delete(this->ownAllocator_,1);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue(&this->currentError_);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue(&this->error_);
  GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  ::~GenericUri(&this->docId_);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue(&this->uri_);
  internal::Stack<rapidjson::CrtAllocator>::Destroy(&this->schemaRef_);
  internal::Stack<rapidjson::CrtAllocator>::Destroy(&this->schemaMap_);
  return;
}

Assistant:

~GenericSchemaDocument() {
        while (!schemaMap_.Empty())
            schemaMap_.template Pop<SchemaEntry>(1)->~SchemaEntry();

        if (typeless_) {
            typeless_->~SchemaType();
            Allocator::Free(typeless_);
        }

        // these may contain some allocator data so clear before deleting ownAllocator_
        uri_.SetNull();
        error_.SetNull();
        currentError_.SetNull();

        RAPIDJSON_DELETE(ownAllocator_);
    }